

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1c2f005::SADSkipx4Test_UnalignedRef_Test::TestBody
          (SADSkipx4Test_UnalignedRef_Test *this)

{
  SADTestBase *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  this_00 = &(this->super_SADSkipx4Test).super_SADTestBase;
  iVar2 = (this->super_SADSkipx4Test).super_SADTestBase.source_stride_;
  iVar1 = (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_;
  (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_ = iVar1 + -1;
  SADTestBase::FillRandom(this_00,(anonymous_namespace)::SADTestBase::source_data_,iVar2);
  iVar2 = (*(this->super_SADSkipx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,0);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var,iVar2),
             (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADSkipx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,1);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_00,iVar2),
             (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADSkipx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,2);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_01,iVar2),
             (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADSkipx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,3);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_02,iVar2),
             (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_);
  SADSkipx4Test::CheckSADs(&this->super_SADSkipx4Test);
  (this->super_SADSkipx4Test).super_SADTestBase.reference_stride_ = iVar1;
  return;
}

Assistant:

TEST_P(SADSkipx4Test, UnalignedRef) {
  // The reference frame, but not the source frame, may be unaligned for
  // certain types of searches.
  int tmp_stride = reference_stride_;
  reference_stride_ -= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  reference_stride_ = tmp_stride;
}